

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.hpp
# Opt level: O0

void duckdb::WindowBoundariesState::ClampFrame(idx_t count,idx_t *values,idx_t *begin,idx_t *end)

{
  unsigned_long uVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  idx_t i;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < in_RDI; local_28 = local_28 + 1) {
    uVar1 = MaxValue<unsigned_long>
                      (*(unsigned_long *)(in_RSI + local_28 * 8),
                       *(unsigned_long *)(in_RDX + local_28 * 8));
    uVar1 = MinValue<unsigned_long>(uVar1,*(unsigned_long *)(in_RCX + local_28 * 8));
    *(unsigned_long *)(in_RSI + local_28 * 8) = uVar1;
  }
  return;
}

Assistant:

static void ClampFrame(const idx_t count, idx_t *values, const idx_t *begin, const idx_t *end) {
		for (idx_t i = 0; i < count; ++i) {
			values[i] = MinValue(MaxValue(values[i], begin[i]), end[i]);
		}
	}